

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void uv__udp_finish_close(uv_udp_t *handle)

{
  uv__queue *puVar1;
  int iVar2;
  uv__queue *puVar3;
  
  iVar2 = uv__io_active(&handle->io_watcher,5);
  if (iVar2 != 0) {
    __assert_fail("!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0x43,"void uv__udp_finish_close(uv_udp_t *)");
  }
  if ((handle->io_watcher).fd == -1) {
    puVar3 = (handle->write_queue).next;
    if (puVar3 != &handle->write_queue) {
      do {
        puVar1 = puVar3->next;
        puVar3->prev->next = puVar1;
        puVar1->prev = puVar3->prev;
        puVar3[10].next = (uv__queue *)0xffffffffffffff83;
        puVar3->next = &handle->write_completed_queue;
        puVar1 = (handle->write_completed_queue).prev;
        puVar3->prev = puVar1;
        puVar1->next = puVar3;
        (handle->write_completed_queue).prev = puVar3;
        puVar3 = (handle->write_queue).next;
      } while (puVar3 != &handle->write_queue);
    }
    uv__udp_run_completed(handle);
    if (handle->send_queue_size == 0) {
      if (handle->send_queue_count == 0) {
        handle->alloc_cb = (uv_alloc_cb)0x0;
        handle->recv_cb = (uv_udp_recv_cb)0x0;
        return;
      }
      __assert_fail("handle->send_queue_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                    ,0x52,"void uv__udp_finish_close(uv_udp_t *)");
    }
    __assert_fail("handle->send_queue_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0x51,"void uv__udp_finish_close(uv_udp_t *)");
  }
  __assert_fail("handle->io_watcher.fd == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                ,0x44,"void uv__udp_finish_close(uv_udp_t *)");
}

Assistant:

void uv__udp_finish_close(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct uv__queue* q;

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
  assert(handle->io_watcher.fd == -1);

  while (!uv__queue_empty(&handle->write_queue)) {
    q = uv__queue_head(&handle->write_queue);
    uv__queue_remove(q);

    req = uv__queue_data(q, uv_udp_send_t, queue);
    req->status = UV_ECANCELED;
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
  }

  uv__udp_run_completed(handle);

  assert(handle->send_queue_size == 0);
  assert(handle->send_queue_count == 0);

  /* Now tear down the handle. */
  handle->recv_cb = NULL;
  handle->alloc_cb = NULL;
  /* but _do not_ touch close_cb */
}